

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

float __thiscall
notch::core::EuclideanLoss::output(EuclideanLoss *this,Array *actual,Array *expected)

{
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  size_t sVar5;
  float fVar6;
  float fVar7;
  
  sVar1 = this->nSize;
  if (sVar1 != actual->_M_size) {
    __assert_fail("nSize == actual.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x789,"virtual float notch::EuclideanLoss::output(const Array &, const Array &)")
    ;
  }
  if (sVar1 == expected->_M_size) {
    fVar6 = 0.0;
    if (sVar1 != 0) {
      pfVar2 = expected->_M_data;
      pfVar3 = actual->_M_data;
      pfVar4 = (this->lossGrad)._M_data;
      sVar5 = 0;
      do {
        fVar7 = pfVar2[sVar5] - pfVar3[sVar5];
        pfVar4[sVar5] = fVar7;
        fVar6 = fVar6 + fVar7 * fVar7;
        sVar5 = sVar5 + 1;
      } while (sVar1 != sVar5);
    }
    if (0.0 <= fVar6) {
      return SQRT(fVar6);
    }
    fVar6 = sqrtf(fVar6);
    return fVar6;
  }
  __assert_fail("nSize == expected.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x78a,"virtual float notch::EuclideanLoss::output(const Array &, const Array &)");
}

Assistant:

virtual float output(const Array &actual, const Array &expected) {
        float lossSquared = 0.0;
        assert (nSize == actual.size());
        assert (nSize == expected.size());
        for (size_t i = 0; i < nSize; ++i) {
            float delta = expected[i] - actual[i];
            lossSquared += (delta*delta);
            lossGrad[i] = delta;
        }
        return std::sqrt(lossSquared);
    }